

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O1

Value __thiscall jbcoin::STArray::getJson(STArray *this,int p)

{
  ValueHolder VVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  uint __val;
  ushort uVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  _func_int **pp_Var10;
  Value *this_00;
  ValueHolder *pVVar11;
  ulong uVar12;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar13;
  uint __len;
  undefined4 in_register_00000034;
  long *plVar14;
  Value VVar15;
  string k;
  uint local_7c;
  long *local_78;
  uint local_70;
  long local_68 [2];
  ValueHolder local_58;
  ushort local_50;
  ValueHolder local_48;
  undefined4 local_3c;
  long *local_38;
  
  *(ushort *)&(this->super_STBase).fName =
       (ushort)*(undefined4 *)&(this->super_STBase).fName & 0xfe00 | 6;
  local_3c = in_EDX;
  pp_Var10 = (_func_int **)operator_new(0x30);
  pp_Var10[2] = (_func_int *)0x0;
  pp_Var10[3] = (_func_int *)0x0;
  pp_Var10[4] = (_func_int *)0x0;
  pp_Var10[5] = (_func_int *)0x0;
  *pp_Var10 = (_func_int *)0x0;
  pp_Var10[1] = (_func_int *)0x0;
  pp_Var10[3] = (_func_int *)(pp_Var10 + 1);
  pp_Var10[4] = (_func_int *)(pp_Var10 + 1);
  pp_Var10[5] = (_func_int *)0x0;
  (this->super_STBase)._vptr_STBase = pp_Var10;
  plVar14 = *(long **)(CONCAT44(in_register_00000034,p) + 0x10);
  local_38 = *(long **)(CONCAT44(in_register_00000034,p) + 0x18);
  uVar13 = extraout_RDX;
  local_48 = (ValueHolder)this;
  if (plVar14 != local_38) {
    local_7c = 1;
    do {
      iVar8 = (**(code **)(*plVar14 + 0x20))(plVar14);
      uVar13 = extraout_RDX_00;
      if (iVar8 != 0) {
        local_70 = local_70 & 0xfffffe00 | 7;
        local_78 = (long *)operator_new(0x30);
        local_78[2] = 0;
        local_78[3] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        *local_78 = 0;
        local_78[1] = 0;
        local_78[3] = (long)(local_78 + 1);
        local_78[4] = (long)(local_78 + 1);
        local_78[5] = 0;
        this_00 = Json::Value::append((Value *)local_48.map_,(Value *)&local_78);
        Json::Value::~Value((Value *)&local_78);
        lVar4 = plVar14[1];
        if (*(long *)(lVar4 + 0x18) == 0) {
          __val = -local_7c;
          if (0 < (int)local_7c) {
            __val = local_7c;
          }
          __len = 1;
          if (9 < __val) {
            uVar12 = (ulong)__val;
            uVar7 = 4;
            do {
              __len = uVar7;
              uVar9 = (uint)uVar12;
              if (uVar9 < 100) {
                __len = __len - 2;
                goto LAB_001afbe8;
              }
              if (uVar9 < 1000) {
                __len = __len - 1;
                goto LAB_001afbe8;
              }
              if (uVar9 < 10000) goto LAB_001afbe8;
              uVar12 = uVar12 / 10000;
              uVar7 = __len + 4;
            } while (99999 < uVar9);
            __len = __len + 1;
          }
LAB_001afbe8:
          local_78 = local_68;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_78,(char)__len - (char)((int)local_7c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_78 + (ulong)(local_7c >> 0x1f)),__len,__val);
        }
        else {
          local_78 = local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,*(long *)(lVar4 + 0x10),
                     *(long *)(lVar4 + 0x18) + *(long *)(lVar4 + 0x10));
        }
        (**(code **)(*plVar14 + 0x38))(&local_58,plVar14,local_3c);
        pVVar11 = &Json::Value::resolveReference(this_00,(char *)local_78,false)->value_;
        uVar6 = _local_50;
        VVar1 = *pVVar11;
        *pVVar11 = local_58;
        bVar2 = pVVar11[1].bool_;
        pVVar11[1].bool_ = local_50._0_1_;
        uVar5 = local_50;
        _local_50 = CONCAT31(stack0xffffffffffffffb1,bVar2);
        uVar3 = *(ushort *)(pVVar11 + 1);
        *(ushort *)(pVVar11 + 1) = uVar3 & 0xfeff | uVar5 & 0x100;
        uVar5 = (ushort)_local_50;
        _local_50 = CONCAT22(SUB42(uVar6,2),uVar5 & 0xfeff | uVar3 & 0x100);
        local_58 = VVar1;
        Json::Value::~Value((Value *)&local_58);
        uVar13 = extraout_RDX_01;
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
          uVar13 = extraout_RDX_02;
        }
        local_7c = local_7c + 1;
      }
      plVar14 = plVar14 + 6;
    } while (plVar14 != local_38);
  }
  VVar15._8_8_ = uVar13;
  VVar15.value_.real_ = local_48.real_;
  return VVar15;
}

Assistant:

Json::Value STArray::getJson (int p) const
{
    Json::Value v = Json::arrayValue;
    int index = 1;
    for (auto const& object: v_)
    {
        if (object.getSType () != STI_NOTPRESENT)
        {
            Json::Value& inner = v.append (Json::objectValue);
            auto const& fname = object.getFName ();
            auto k = fname.hasName () ? fname.fieldName : std::to_string(index);
            inner[k] = object.getJson (p);
            index++;
        }
    }
    return v;
}